

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::java::GetBitFieldName_abi_cxx11_
          (string *__return_storage_ptr__,java *this,int index)

{
  char *pcVar1;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  char *local_58;
  long local_50;
  char local_48 [32];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"bitField","");
  local_58 = local_48;
  pcVar1 = FastInt32ToBufferLeft((int32)this,local_48);
  local_50 = (long)pcVar1 - (long)local_48;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,local_58,local_58 + local_50);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78[0]);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string GetBitFieldName(int index) {
  std::string varName = "bitField";
  varName += StrCat(index);
  varName += "_";
  return varName;
}